

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QDirPrivate * __thiscall QDir::d_func(QDir *this)

{
  QDirPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QDirPrivate>::data(&this->d_ptr);
  return pQVar1;
}

Assistant:

QDirPrivate* QDir::d_func()
{
    return d_ptr.data();
}